

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::initialiseSolve(HEkkDual *this)

{
  reference pvVar1;
  long in_RDI;
  HighsInt iRow;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  
  *(undefined8 *)(in_RDI + 0xc0) = *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x118);
  *(undefined8 *)(in_RDI + 0xd0) = *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x120);
  *(undefined8 *)(in_RDI + 0xd8) = *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0x10) + 8) + 0x140);
  *(undefined8 *)(in_RDI + 0xb8) = *(undefined8 *)(in_RDI + 0xc0);
  *(undefined8 *)(in_RDI + 200) = *(undefined8 *)(in_RDI + 0xd0);
  *(undefined1 *)(in_RDI + 0xa8) = 1;
  iVar2 = 0;
  do {
    if (*(int *)(in_RDI + 0x18) <= iVar2) {
LAB_00785336:
      interpretDualEdgeWeightStrategy
                ((HEkkDual *)CONCAT44(iVar2,in_stack_fffffffffffffff0),
                 (HighsInt)((ulong)in_RDI >> 0x20));
      *(undefined4 *)(*(long *)(in_RDI + 0x10) + 0x2970) = 0;
      *(undefined1 *)(*(long *)(in_RDI + 0x10) + 0x3708) = 0;
      *(undefined1 *)(*(long *)(in_RDI + 0x10) + 0x3709) = 0;
      *(undefined4 *)(*(long *)(in_RDI + 0x10) + 0x370c) = 2;
      *(undefined4 *)(in_RDI + 0xe8) = 0;
      return;
    }
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(*(long *)(in_RDI + 0x10) + 0x2978),
                        (long)iVar2);
    if (*pvVar1 < *(int *)(in_RDI + 0x1c)) {
      *(undefined1 *)(in_RDI + 0xa8) = 0;
      goto LAB_00785336;
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

void HEkkDual::initialiseSolve() {
  // Copy values of simplex solver options to dual simplex options
  primal_feasibility_tolerance =
      ekk_instance_.options_->primal_feasibility_tolerance;
  dual_feasibility_tolerance =
      ekk_instance_.options_->dual_feasibility_tolerance;
  objective_bound = ekk_instance_.options_->objective_bound;

  // Copy tolerances
  // ToDo: Eliminate these horribly-named unnecessary copies!
  Tp = primal_feasibility_tolerance;
  Td = dual_feasibility_tolerance;

  initial_basis_is_logical_ = true;
  for (HighsInt iRow = 0; iRow < solver_num_row; iRow++) {
    if (ekk_instance_.basis_.basicIndex_[iRow] < solver_num_col) {
      initial_basis_is_logical_ = false;
      break;
    }
  }

  interpretDualEdgeWeightStrategy(
      ekk_instance_.info_.dual_edge_weight_strategy);

  // Initialise model and run status values
  ekk_instance_.model_status_ = HighsModelStatus::kNotset;
  ekk_instance_.solve_bailout_ = false;
  ekk_instance_.called_return_from_solve_ = false;
  ekk_instance_.exit_algorithm_ = SimplexAlgorithm::kDual;

  rebuild_reason = kRebuildReasonNo;
}